

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCase *testCase)

{
  pointer pcVar1;
  size_t __n;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  logic_error *this_00;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string name;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  pcVar1 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (testCase->super_TestCaseInfo).name._M_string_length);
  uVar6 = local_60;
  puVar2 = local_68;
  if (local_60 != 0) {
    uVar5 = 0;
    do {
      iVar3 = tolower((int)(char)puVar2[uVar5]);
      puVar2[uVar5] = (char)iVar3;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  switch(this->m_wildcardPosition) {
  case NoWildcard:
    __n = (this->m_stringToMatch)._M_string_length;
    if (__n == local_60) {
      if (__n == 0) {
        bVar7 = true;
      }
      else {
        iVar3 = bcmp((this->m_stringToMatch)._M_dataplus._M_p,local_68,__n);
        bVar7 = iVar3 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    goto LAB_001387c1;
  case WildcardAtStart:
    uVar6 = (this->m_stringToMatch)._M_string_length;
    if (local_60 < uVar6) goto LAB_0013879f;
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&local_68);
LAB_0013877b:
    if (local_40 != (this->m_stringToMatch)._M_string_length) goto LAB_0013879f;
    if (local_40 == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = bcmp(local_48,(this->m_stringToMatch)._M_dataplus._M_p,local_40);
      bVar7 = iVar3 == 0;
    }
    break;
  case WildcardAtEnd:
    uVar6 = (this->m_stringToMatch)._M_string_length;
    if (uVar6 <= local_60) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)&local_68);
      goto LAB_0013877b;
    }
LAB_0013879f:
    bVar7 = false;
    break;
  case WildcardAtBothEnds:
    lVar4 = std::__cxx11::string::find
                      ((char *)&local_68,(ulong)(this->m_stringToMatch)._M_dataplus._M_p,0);
    bVar7 = lVar4 != -1;
    goto LAB_001387c1;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((uVar6 <= local_60) && (local_48 != local_38)) {
    operator_delete(local_48);
  }
LAB_001387c1:
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return bVar7;
}

Assistant:

bool isMatch( TestCase const& testCase ) const {
            std::string name = testCase.getTestCaseInfo().name;
            toLowerInPlace( name );

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }